

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::TypeParameterizedTestSuiteRegistry::CheckForInstantiations
          (TypeParameterizedTestSuiteRegistry *this)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  *__k;
  _Rb_tree_color _Var1;
  char *pcVar2;
  _Alloc_hider name;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  const_iterator cVar3;
  TestFactoryBase *factory;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  allocator local_1b1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b0;
  _Base_ptr local_1a8;
  _Rb_tree_node_base *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  CodeLocation local_178;
  string full_name;
  string message;
  anon_class_112_2_99c2db9c_for_factory_ local_110;
  anon_class_112_2_99c2db9c_for_factory_ local_a0;
  
  this_00 = &GetIgnoredParameterizedTestSuites_abi_cxx11_()->_M_t;
  p_Var5 = &(this->suites_)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var6 = &(((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
  local_1b0 = this_00;
  local_1a8 = p_Var6;
  local_1a0 = p_Var5;
  for (p_Var4 = (this->suites_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var4 != p_Var5; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    if (*(char *)&p_Var4[3]._M_parent == '\0') {
      __k = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
             *)(p_Var4 + 1);
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(this_00,(key_type *)__k);
      if (cVar3._M_node == p_Var6) {
        std::operator+(&local_198,"Type paramaterized test suite ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        std::operator+(&local_178.file,&local_198,
                       " is defined via REGISTER_TYPED_TEST_SUITE_P, but never instantiated via INSTANTIATE_TYPED_TEST_SUITE_P. None of the test cases will run.\n\nIdeally, TYPED_TEST_P definitions should only ever be included as part of binaries that intend to use them. (As opposed to, for example, being placed in a library that may be linked in to get other utilities.)\n\nTo suppress this error for this test suite, insert the following line (in a non-header) in the namespace it is definedin in:\n\nGTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST("
                      );
        std::operator+(&local_a0.message,&local_178.file,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        std::operator+(&message,&local_a0.message,");");
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_198);
        std::operator+(&local_a0.message,"UninstantiatedTypeParamaterizedTestSuite<",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        std::operator+(&full_name,&local_a0.message,">");
        std::__cxx11::string::~string((string *)&local_a0);
        name = full_name._M_dataplus;
        pcVar2 = *(char **)(p_Var4 + 2);
        _Var1 = p_Var4[3]._M_color;
        std::__cxx11::string::string((string *)&local_110,(string *)&message);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
        ::pair(&local_110.testcase,__k);
        std::__cxx11::string::string((string *)&local_198,pcVar2,&local_1b1);
        std::__cxx11::string::string((string *)&local_178,(string *)&local_198);
        local_178.line = _Var1;
        factory = (TestFactoryBase *)operator_new(0x78);
        CheckForInstantiations()::$_0::__0((__0 *)&local_a0,&local_110);
        factory->_vptr_TestFactoryBase =
             (_func_int **)
             (
             _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal34TypeParameterizedTestSuiteRegistry22CheckForInstantiationsEvE3__0EEPNS_8TestInfoEPKcS8_S8_S8_S8_iT0_E11FactoryImpl
             + 0x10);
        CheckForInstantiations()::$_0::__0((__0 *)(factory + 1),&local_a0);
        MakeAndRegisterTestInfo
                  ("GoogleTestVerification",name._M_p,(char *)0x0,(char *)0x0,&local_178,
                   &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
                   (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
        CheckForInstantiations()::$_0::~__0((__0 *)&local_a0);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_198);
        CheckForInstantiations()::$_0::~__0((__0 *)&local_110);
        std::__cxx11::string::~string((string *)&full_name);
        std::__cxx11::string::~string((string *)&message);
        p_Var5 = local_1a0;
        this_00 = local_1b0;
        p_Var6 = local_1a8;
      }
    }
  }
  return;
}

Assistant:

void TypeParameterizedTestSuiteRegistry::CheckForInstantiations() {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  for (const auto& testcase : suites_) {
    if (testcase.second.instantiated) continue;
    if (ignored.find(testcase.first) != ignored.end()) continue;

    std::string message =
        "Type paramaterized test suite " + testcase.first +
        " is defined via REGISTER_TYPED_TEST_SUITE_P, but never instantiated "
        "via INSTANTIATE_TYPED_TEST_SUITE_P. None of the test cases will run."
        "\n\n"
        "Ideally, TYPED_TEST_P definitions should only ever be included as "
        "part of binaries that intend to use them. (As opposed to, for "
        "example, being placed in a library that may be linked in to get other "
        "utilities.)"
        "\n\n"
        "To suppress this error for this test suite, insert the following line "
        "(in a non-header) in the namespace it is definedin in:"
        "\n\n"
        "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" +
        testcase.first + ");";

    std::string full_name =
        "UninstantiatedTypeParamaterizedTestSuite<" + testcase.first + ">";
    RegisterTest(  //
        "GoogleTestVerification", full_name.c_str(),
        nullptr,  // No type parameter.
        nullptr,  // No value parameter.
        testcase.second.code_location.file.c_str(),
        testcase.second.code_location.line, [message, testcase] {
          return new FailureTest(testcase.second.code_location, message,
                                 kErrorOnUninstantiatedTypeParameterizedTest);
        });
  }
}